

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

int __thiscall TSparseArray::LoadFromStream(TSparseArray *this,TByteStream *InStream)

{
  uint local_28;
  int nError;
  DWORD valid_count;
  DWORD total_count;
  TByteStream *InStream_local;
  TSparseArray *this_local;
  
  nError = 0;
  local_28 = 0;
  _valid_count = InStream;
  InStream_local = (TByteStream *)this;
  this_local._4_4_ = TGenericArray<unsigned_int>::LoadFromStream(&this->ItemBits,InStream);
  if (((this_local._4_4_ == 0) &&
      (this_local._4_4_ = TByteStream::GetValue<unsigned_int>(_valid_count,(uint *)&nError),
      this_local._4_4_ == 0)) &&
     (this_local._4_4_ = TByteStream::GetValue<unsigned_int>(_valid_count,&local_28),
     this_local._4_4_ == 0)) {
    if ((uint)nError < local_28) {
      this_local._4_4_ = 0x3ec;
    }
    else {
      this->TotalItemCount = (ulong)(uint)nError;
      this->ValidItemCount = (ulong)local_28;
      this_local._4_4_ = TGenericArray<_BASEVALS>::LoadFromStream(&this->BaseVals,_valid_count);
      if (((this_local._4_4_ == 0) &&
          (this_local._4_4_ =
                TGenericArray<unsigned_int>::LoadFromStream(&this->IndexToItem0,_valid_count),
          this_local._4_4_ == 0)) &&
         (this_local._4_4_ =
               TGenericArray<unsigned_int>::LoadFromStream(&this->IndexToItem1,_valid_count),
         this_local._4_4_ == 0)) {
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int LoadFromStream(TByteStream & InStream)
    {
        DWORD total_count = 0;
        DWORD valid_count = 0;
        int nError;

        nError = ItemBits.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = InStream.GetValue<DWORD>(total_count);
        if(nError != ERROR_SUCCESS)
            return nError;
        nError = InStream.GetValue<DWORD>(valid_count);
        if(nError != ERROR_SUCCESS)
            return nError;
        if(valid_count > total_count)
            return ERROR_FILE_CORRUPT;

        TotalItemCount = total_count;
        ValidItemCount = valid_count;

        nError = BaseVals.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = IndexToItem0.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = IndexToItem1.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        return ERROR_SUCCESS;
    }